

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O3

void __thiscall
DConversationMenu::DConversationMenu(DConversationMenu *this,FStrifeDialogueNode *CurNode)

{
  uint *puVar1;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  BYTE *__s1;
  FBrokenLines *pFVar6;
  char *pcVar7;
  char *pcVar8;
  BYTE *string;
  int iVar9;
  FString *other;
  FStrifeDialogueReply *pFVar10;
  char goodbye [25];
  FString local_60;
  FString local_58 [4];
  FStrifeDialogueNode *local_38;
  
  DMenu::DMenu(&this->super_DMenu,(DMenu *)0x0);
  (this->super_DMenu).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_00870d80;
  (this->mSpeaker).Chars = FString::NullString.Nothing;
  iVar9 = FString::NullString.RefCount;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  (this->mResponses).Array = (uint *)0x0;
  (this->mResponses).Most = 0;
  (this->mResponses).Count = 0;
  (this->mResponseLines).Array = (FString *)0x0;
  (this->mResponseLines).Most = 0;
  (this->mResponseLines).Count = 0;
  this->mCurNode = CurNode;
  this->mDialogueLines = (FBrokenLines *)0x0;
  this->mShowGold = false;
  __s1 = (BYTE *)CurNode->Dialogue;
  local_38 = CurNode;
  iVar4 = strncmp((char *)__s1,"RANDOM_",7);
  if (iVar4 == 0) {
    local_58[0].Chars = FString::NullString.Nothing;
    FString::NullString.RefCount = iVar9 + 2;
    uVar5 = FRandom::GenRand32(&pr_randomspeech);
    FString::Format(local_58,"TXT_%s_%02d",__s1,
                    (ulong)(byte)((char)uVar5 + ((byte)((uVar5 & 0xff) / 5) & 0xfe) * -5 + 1));
    __s1 = (BYTE *)FStringTable::operator[](&GStrings,local_58[0].Chars);
    if (__s1 == (BYTE *)0x0) {
      __s1 = (BYTE *)FStringTable::operator[](&GStrings,"TXT_GOAWAY");
    }
    FString::~FString(local_58);
  }
  else if (*__s1 == '$') {
    __s1 = (BYTE *)FStringTable::operator()(&GStrings,(char *)(__s1 + 1));
  }
  string = ".";
  if (__s1 != (BYTE *)0x0) {
    string = __s1;
  }
  pFVar6 = V_BreakLines(SmallFont,
                        (screen->super_DSimpleCanvas).super_DCanvas.Width / CleanXfac + -0x30,string
                        ,false);
  this->mDialogueLines = pFVar6;
  pFVar10 = local_38->Children;
  if (pFVar10 != (FStrifeDialogueReply *)0x0) {
    do {
      pcVar7 = pFVar10->Reply;
      if (pcVar7 != (char *)0x0) {
        this->mShowGold = (bool)(this->mShowGold | pFVar10->NeedsGold);
        if (*pcVar7 == '$') {
          pcVar7 = FStringTable::operator()(&GStrings,pcVar7 + 1);
        }
        FString::FString(local_58,pcVar7);
        if (pFVar10->NeedsGold == true) {
          FString::AppendFormat
                    (local_58," for %u",(ulong)(uint)((pFVar10->ItemCheck).Array)->Amount);
        }
        pFVar6 = V_BreakLines(SmallFont,0x104,(BYTE *)local_58[0].Chars,false);
        uVar5 = (this->mResponseLines).Count;
        TArray<unsigned_int,_unsigned_int>::Grow(&this->mResponses,1);
        (this->mResponses).Array[(this->mResponses).Count] = uVar5;
        puVar1 = &(this->mResponses).Count;
        *puVar1 = *puVar1 + 1;
        if (-1 < pFVar6->Width) {
          other = &pFVar6->Text;
          do {
            TArray<FString,_FString>::Grow(&this->mResponseLines,1);
            FString::AttachToOther
                      ((this->mResponseLines).Array + (this->mResponseLines).Count,other);
            puVar1 = &(this->mResponseLines).Count;
            *puVar1 = *puVar1 + 1;
            piVar2 = (int *)(other + 1);
            other = other + 2;
          } while (-1 < *piVar2);
        }
        V_FreeBrokenLines(pFVar6);
        FString::~FString(local_58);
      }
      pFVar10 = pFVar10->Next;
    } while (pFVar10 != (FStrifeDialogueReply *)0x0);
  }
  uVar5 = FRandom::GenRand32(&pr_randomspeech);
  mysnprintf((char *)local_58,0x19,"TXT_RANDOMGOODBYE_%d",
             (ulong)(byte)((char)uVar5 + (char)((uVar5 & 0xff) / 3) * -3 + 1));
  pcVar8 = FStringTable::operator[](&GStrings,(char *)local_58);
  uVar5 = (this->mResponseLines).Count;
  TArray<unsigned_int,_unsigned_int>::Grow(&this->mResponses,1);
  (this->mResponses).Array[(this->mResponses).Count] = uVar5;
  puVar1 = &(this->mResponses).Count;
  *puVar1 = *puVar1 + 1;
  pcVar7 = "Bye.";
  if (pcVar8 != (char *)0x0) {
    pcVar7 = pcVar8;
  }
  FString::FString(&local_60,pcVar7);
  TArray<FString,_FString>::Grow(&this->mResponseLines,1);
  FString::AttachToOther((this->mResponseLines).Array + (this->mResponseLines).Count,&local_60);
  puVar1 = &(this->mResponseLines).Count;
  *puVar1 = *puVar1 + 1;
  FString::~FString(&local_60);
  ConversationMenuY = 0xc0 - (this->mResponseLines).Count * OptionSettings.mLinespacing;
  if (0x8b < ConversationMenuY) {
    ConversationMenuY = 0x8c;
  }
  this->mYpos = ConversationMenuY;
  pFVar6 = this->mDialogueLines;
  iVar9 = 0x86;
  do {
    iVar9 = iVar9 + 10;
    piVar2 = &pFVar6->Width;
    pFVar6 = pFVar6 + 1;
  } while (-1 < *piVar2);
  uVar3 = (long)(screen->super_DSimpleCanvas).super_DCanvas.Height / (long)CleanYfac;
  iVar4 = (int)(((uint)(uVar3 >> 0x1f) & 1) + (int)uVar3) >> 1;
  if (ConversationMenuY + -100 < (iVar9 - iVar4) + -100) {
    ConversationMenuY = iVar9 - iVar4;
    this->mYpos = ConversationMenuY;
  }
  return;
}

Assistant:

DConversationMenu(FStrifeDialogueNode *CurNode) 
	{
		mCurNode = CurNode;
		mDialogueLines = NULL;
		mShowGold = false;

		// Format the speaker's message.
		const char * toSay = CurNode->Dialogue;
		if (strncmp (toSay, "RANDOM_", 7) == 0)
		{
			FString dlgtext;

			dlgtext.Format("TXT_%s_%02d", toSay, 1+(pr_randomspeech() % NUM_RANDOM_LINES));
			toSay = GStrings[dlgtext];
			if (toSay == NULL)
			{
				toSay = GStrings["TXT_GOAWAY"];	// Ok, it's lame - but it doesn't look like an error to the player. ;)
			}
		}
		else
		{
			// handle string table replacement
			if (toSay[0] == '$')
			{
				toSay = GStrings(toSay + 1);
			}
		}
		if (toSay == NULL)
		{
			toSay = ".";
		}
		mDialogueLines = V_BreakLines (SmallFont, screen->GetWidth()/CleanXfac - 24*2, toSay);

		FStrifeDialogueReply *reply;
		int i,j;
		for (reply = CurNode->Children, i = 1; reply != NULL; reply = reply->Next)
		{
			if (reply->Reply == NULL)
			{
				continue;
			}
			mShowGold |= reply->NeedsGold;

			const char *ReplyText = reply->Reply;
			if (ReplyText[0] == '$')
			{
				ReplyText = GStrings(ReplyText + 1);
			}
			FString ReplyString = ReplyText;
			if (reply->NeedsGold) ReplyString.AppendFormat(" for %u", reply->ItemCheck[0].Amount);

			FBrokenLines *ReplyLines = V_BreakLines (SmallFont, 320-50-10, ReplyString);

			mResponses.Push(mResponseLines.Size());
			for (j = 0; ReplyLines[j].Width >= 0; ++j)
			{
				mResponseLines.Push(ReplyLines[j].Text);
			}
			++i;
			V_FreeBrokenLines (ReplyLines);
		}
		char goodbye[25];
		mysnprintf(goodbye, countof(goodbye), "TXT_RANDOMGOODBYE_%d", 1+(pr_randomspeech() % NUM_RANDOM_GOODBYES));
		const char *goodbyestr = GStrings[goodbye];
		if (goodbyestr == NULL) goodbyestr = "Bye.";
		mResponses.Push(mResponseLines.Size());
		mResponseLines.Push(FString(goodbyestr));

		// Determine where the top of the reply list should be positioned.
		i = OptionSettings.mLinespacing;
		mYpos = MIN<int> (140, 192 - mResponseLines.Size() * i);
		for (i = 0; mDialogueLines[i].Width >= 0; ++i)
		{ }
		i = 44 + i * 10;
		if (mYpos - 100 < i - screen->GetHeight() / CleanYfac / 2)
		{
			mYpos = i - screen->GetHeight() / CleanYfac / 2 + 100;
		}
		ConversationMenuY = mYpos;
		//ConversationMenu.indent = 50;
	}